

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509write_crt.c
# Opt level: O1

int mbedtls_x509write_crt_set_key_usage(mbedtls_x509write_cert *ctx,uint key_usage)

{
  int iVar1;
  uchar ku;
  uchar buf [4];
  uchar *c;
  uchar local_15;
  uchar local_14 [4];
  uchar **local_10;
  
  if ((key_usage & 0xffffff01) != 0) {
    return -0x2080;
  }
  local_10 = (uchar **)&local_10;
  local_15 = (uchar)key_usage;
  iVar1 = mbedtls_asn1_write_bitstring((uchar **)&local_10,local_14,&local_15,7);
  if (iVar1 == 4) {
    iVar1 = mbedtls_x509_set_extension(&ctx->extensions,"U\x1d\x0f",3,1,local_14,4);
  }
  return iVar1;
}

Assistant:

int mbedtls_x509write_crt_set_key_usage( mbedtls_x509write_cert *ctx,
                                         unsigned int key_usage )
{
    unsigned char buf[4], ku;
    unsigned char *c;
    int ret;

    /* We currently only support 7 bits, from 0x80 to 0x02 */
    if( ( key_usage & ~0xfe ) != 0 )
        return( MBEDTLS_ERR_X509_FEATURE_UNAVAILABLE );

    c = buf + 4;
    ku = (unsigned char) key_usage;

    if( ( ret = mbedtls_asn1_write_bitstring( &c, buf, &ku, 7 ) ) != 4 )
        return( ret );

    ret = mbedtls_x509write_crt_set_extension( ctx, MBEDTLS_OID_KEY_USAGE,
                                       MBEDTLS_OID_SIZE( MBEDTLS_OID_KEY_USAGE ),
                                       1, buf, 4 );
    if( ret != 0 )
        return( ret );

    return( 0 );
}